

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void __thiscall google::protobuf::internal::ExtensionSet::Clear(ExtensionSet *this)

{
  ExtensionSet *this_local;
  
  ForEach<google::protobuf::internal::ExtensionSet::Clear()::__0>(this);
  return;
}

Assistant:

void ExtensionSet::Clear() {
  ForEach([](int /* number */, Extension& ext) { ext.Clear(); });
}